

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCharEncOutFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  int toconv;
  int len;
  xmlChar charref [20];
  int local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  ulong local_50;
  uchar local_48 [24];
  
  local_54 = -1;
  if (out != (xmlBufferPtr)0x0 && handler != (xmlCharEncodingHandler *)0x0) {
    iVar5 = 0;
    while( true ) {
      local_60 = out->size - out->use;
      local_60 = local_60 - (uint)(0 < local_60);
      if (in == (xmlBufferPtr)0x0) break;
      local_5c = in->use;
      if (local_60 <= (int)(local_5c * 4)) {
        xmlBufferGrow(out,local_5c * 4);
        local_60 = ~out->use + out->size;
      }
      if (handler->output == (xmlCharEncodingOutputFunc)0x0) {
        local_60 = 0;
        local_5c = 0;
        uVar2 = 0xffffffff;
      }
      else {
        uVar2 = (*handler->output)(out->content + out->use,&local_60,in->content,(int *)&local_5c);
        uVar2 = (int)uVar2 >> 0x1f & uVar2;
      }
      xmlBufferShrink(in,local_5c);
      uVar4 = out->use + local_60;
      out->use = uVar4;
      iVar5 = iVar5 + local_60;
      out->content[uVar4] = '\0';
      if (uVar2 != 0xfffffffd) {
        if (uVar2 != 0xfffffffe) {
          if (iVar5 == 0) {
            return uVar2;
          }
          return iVar5;
        }
        local_58 = in->use;
        iVar3 = xmlGetUTF8Char(in->content,(int *)&local_58);
        if (iVar3 < 1) {
          local_54 = -2;
          bVar1 = false;
        }
        else {
          uVar2 = xmlSerializeDecCharRef((char *)local_48,iVar3);
          xmlBufferShrink(in,local_58);
          xmlBufferGrow(out,uVar2 * 4);
          local_60 = ~out->use + out->size;
          local_50 = (ulong)uVar2;
          if (handler->output == (xmlCharEncodingOutputFunc)0x0) {
            bVar6 = false;
            local_60 = 0;
            local_5c = 0;
          }
          else {
            local_5c = uVar2;
            iVar3 = (*handler->output)(out->content + out->use,&local_60,local_48,(int *)&local_5c);
            bVar6 = -1 < iVar3;
          }
          bVar1 = false;
          if ((bVar6) && (local_5c == (uint)local_50)) {
            uVar2 = out->use + local_60;
            out->use = uVar2;
            iVar5 = iVar5 + local_60;
            out->content[uVar2] = '\0';
            bVar1 = true;
          }
          else {
            local_54 = -1;
          }
        }
        if (!bVar1) {
          return local_54;
        }
      }
    }
    local_5c = 0;
    if (handler->output == (xmlCharEncodingOutputFunc)0x0) {
      local_60 = 0;
    }
    else {
      (*handler->output)(out->content + out->use,&local_60,(uchar *)0x0,(int *)&local_5c);
    }
    uVar2 = out->use + local_60;
    out->use = uVar2;
    out->content[uVar2] = '\0';
    local_54 = 0;
  }
  return local_54;
}

Assistant:

int
xmlCharEncOutFunc(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                  xmlBufferPtr in) {
    int ret;
    int written;
    int writtentot = 0;
    int toconv;

    if (handler == NULL) return(XML_ENC_ERR_INTERNAL);
    if (out == NULL) return(XML_ENC_ERR_INTERNAL);

retry:

    written = out->size - out->use;

    if (written > 0)
	written--; /* Gennady: count '/0' */

    /*
     * First specific handling of in = NULL, i.e. the initialization call
     */
    if (in == NULL) {
        toconv = 0;
        /* TODO: Check return value. */
        xmlEncOutputChunk(handler, &out->content[out->use], &written,
                          NULL, &toconv);
        out->use += written;
        out->content[out->use] = 0;
        return(0);
    }

    /*
     * Conversion itself.
     */
    toconv = in->use;
    if (toconv * 4 >= written) {
        xmlBufferGrow(out, toconv * 4);
	written = out->size - out->use - 1;
    }
    ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                            in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    writtentot += written;
    out->content[out->use] = 0;

    if (ret == XML_ENC_ERR_SPACE)
        goto retry;

    /*
     * Attempt to handle error cases
     */
    if (ret == XML_ENC_ERR_INPUT) {
        xmlChar charref[20];
        int len = in->use;
        const xmlChar *utf = (const xmlChar *) in->content;
        int cur, charrefLen;

        cur = xmlGetUTF8Char(utf, &len);
        if (cur <= 0)
            return(ret);

        /*
         * Removes the UTF8 sequence, and replace it by a charref
         * and continue the transcoding phase, hoping the error
         * did not mangle the encoder state.
         */
        charrefLen = xmlSerializeDecCharRef((char *) charref, cur);
        xmlBufferShrink(in, len);
        xmlBufferGrow(out, charrefLen * 4);
        written = out->size - out->use - 1;
        toconv = charrefLen;
        ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                                charref, &toconv);
        if ((ret < 0) || (toconv != charrefLen))
            return(XML_ENC_ERR_INTERNAL);

        out->use += written;
        writtentot += written;
        out->content[out->use] = 0;
        goto retry;
    }
    return(writtentot ? writtentot : ret);
}